

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

optional<std::array<float,_2UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_value<std::array<float,2ul>>
          (optional<std::array<float,_2UL>_> *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  bool bVar3;
  optional<std::array<float,_2UL>_> local_24;
  
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar3 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar3 = uVar2 == 4;
  }
  if ((bVar3) || ((this->_blocked & 1U) != 0)) {
LAB_0028dcdc:
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<std::array<float,_2UL>_>)0x0;
  }
  else {
    pvVar1 = (this->_value).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      if (uVar2 == 0) goto LAB_0028dcdc;
    }
    pvVar1 = (this->_value).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      if (uVar2 == 1) goto LAB_0028dcdc;
    }
    tinyusdz::value::Value::get_value<std::array<float,2ul>>(&local_24,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_24.has_value_;
    if (local_24.has_value_ == true) {
      __return_storage_ptr__->contained = local_24.contained;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }